

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.cpp
# Opt level: O1

void __thiscall TempData::start(TempData *this)

{
  path *this_00;
  bool bVar1;
  int iVar2;
  string *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  pointer pcVar3;
  size_t fileCount;
  size_t equCount;
  size_t labelCount;
  size_t lineCount;
  char *local_70;
  string local_68;
  size_t local_48;
  unsigned_long local_40;
  unsigned_long local_38;
  
  this_00 = &(this->file).fileName;
  bVar1 = ghc::filesystem::path::empty(this_00);
  if (!bVar1) {
    iVar2 = TextFile::open(&this->file,(char *)0x1,5);
    if ((char)iVar2 == '\0') {
      ghc::filesystem::path::u8string_abi_cxx11_(&local_68,this_00);
      Logger::printError<std::__cxx11::string>((Logger *)0x1,0x18a7f3,(char *)&local_68,in_RCX);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_68._M_dataplus._M_p = (pointer)FileList::size(&Global.fileList);
      local_38 = (unsigned_long)Global.FileInfo.TotalLineCount;
      local_40 = (long)Global.symbolTable.labels.
                       super__Vector_base<std::shared_ptr<Label>,_std::allocator<std::shared_ptr<Label>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)Global.symbolTable.labels.
                       super__Vector_base<std::shared_ptr<Label>,_std::allocator<std::shared_ptr<Label>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4;
      local_48 = Global.symbolTable.equationsCount;
      local_70 = "files";
      if (local_68._M_dataplus._M_p == (pointer)0x1) {
        local_70 = "file";
      }
      TextFile::writeFormat<unsigned_long,char_const*>
                (&this->file,"; %d %S included\n",(unsigned_long *)&local_68,&local_70);
      local_70 = "lines";
      if (local_38 == 1) {
        local_70 = "line";
      }
      TextFile::writeFormat<unsigned_long,char_const*>(&this->file,"; %d %S\n",&local_38,&local_70);
      local_70 = "labels";
      if (local_40 == 1) {
        local_70 = "label";
      }
      TextFile::writeFormat<unsigned_long,char_const*>(&this->file,"; %d %S\n",&local_40,&local_70);
      local_70 = "equations";
      if (local_48 == 1) {
        local_70 = "equation";
      }
      TextFile::writeFormat<unsigned_long,char_const*>
                (&this->file,"; %d %S\n\n",&local_48,&local_70);
      if (local_68._M_dataplus._M_p != (pointer)0x0) {
        pcVar3 = (pointer)0x0;
        do {
          args = FileList::string_abi_cxx11_(&Global.fileList,(int)pcVar3);
          TextFile::writeFormat<std::__cxx11::string>(&this->file,"; %S\n",args);
          pcVar3 = pcVar3 + 1;
        } while (pcVar3 < local_68._M_dataplus._M_p);
      }
      TextFile::writeLine(&this->file,"");
    }
  }
  return;
}

Assistant:

void TempData::start()
{
	if (!file.getFileName().empty())
	{
		if (!file.open(TextFile::Write))
		{
			Logger::printError(Logger::Error,"Could not open temp file %s.",file.getFileName().u8string());
			return;
		}

		size_t fileCount = Global.fileList.size();
		size_t lineCount = Global.FileInfo.TotalLineCount;
		size_t labelCount = Global.symbolTable.getLabelCount();
		size_t equCount = Global.symbolTable.getEquationCount();

		file.writeFormat("; %d %S included\n",fileCount,fileCount == 1 ? "file" : "files");
		file.writeFormat("; %d %S\n",lineCount,lineCount == 1 ? "line" : "lines");
		file.writeFormat("; %d %S\n",labelCount,labelCount == 1 ? "label" : "labels");
		file.writeFormat("; %d %S\n\n",equCount,equCount == 1 ? "equation" : "equations");
		for (size_t i = 0; i < fileCount; i++)
		{
			file.writeFormat("; %S\n",Global.fileList.string(int(i)));
		}
		file.writeLine("");
	}
}